

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_dec.cc
# Opt level: O0

int asn1_d2i_ex_primitive
              (ASN1_VALUE **pval,uchar **in,long inlen,ASN1_ITEM *it,int tag,int aclass,char opt)

{
  int iVar1;
  size_t sVar2;
  uint8_t *puVar3;
  ASN1_ITEM *it_00;
  bool bVar4;
  undefined1 local_80 [7];
  uint8_t v;
  CBS cbs;
  int is_string;
  uchar oclass;
  long len;
  uchar *cont;
  uchar *p;
  size_t sStack_48;
  char cst;
  long plen;
  int utype;
  int ret;
  int aclass_local;
  int tag_local;
  ASN1_ITEM *it_local;
  long inlen_local;
  uchar **in_local;
  ASN1_VALUE **pval_local;
  
  plen._4_4_ = 0;
  utype = aclass;
  ret = tag;
  _aclass_local = it;
  it_local = (ASN1_ITEM *)inlen;
  inlen_local = (long)in;
  in_local = (uchar **)pval;
  if (pval == (ASN1_VALUE **)0x0) {
    ERR_put_error(0xc,0,0x84,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,0x271);
    return 0;
  }
  bVar4 = true;
  if (it->itype != '\0') {
    bVar4 = it->itype == '\x05';
  }
  if (!bVar4) {
    __assert_fail("it->itype == ASN1_ITYPE_PRIMITIVE || it->itype == ASN1_ITYPE_MSTRING",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,0x275,
                  "int asn1_d2i_ex_primitive(ASN1_VALUE **, const unsigned char **, long, const ASN1_ITEM *, int, int, char)"
                 );
  }
  if (it->itype == '\x05') {
    ret = -1;
    plen._0_4_ = tag;
  }
  else {
    plen._0_4_ = it->utype;
  }
  if (((int)plen == -4) || ((int)plen == -5)) {
    if (-1 < ret) {
      ERR_put_error(0xc,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0x281);
      return 0;
    }
    if (opt != '\0') {
      ERR_put_error(0xc,0,0x87,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0x285);
      return 0;
    }
    cbs.len._0_4_ = (uint)((int)plen == -5);
    cont = *in;
    plen._4_4_ = asn1_check_tlen((long *)&stack0xffffffffffffffb8,(int *)&plen,
                                 (uchar *)((long)&cbs.len + 7),(char *)((long)&p + 7),&cont,inlen,-1
                                 ,0,'\0');
    if (plen._4_4_ == 0) {
      ERR_put_error(0xc,0,0x9e,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0x28c);
      return 0;
    }
    iVar1 = is_supported_universal_type((int)plen,(uint)cbs.len._7_1_);
    if (iVar1 == 0) {
      plen._0_4_ = -3;
    }
    if (((uint)cbs.len != 0) && ((((int)plen == 6 || ((int)plen == 5)) || ((int)plen == 1)))) {
      if (p._7_1_ != '\0') {
        ERR_put_error(0xc,0,0xb3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                      ,0x297);
        return 0;
      }
      CBS_init((CBS *)local_80,cont,sStack_48);
      if (((int)plen == 6) && (iVar1 = CBS_is_valid_asn1_oid((CBS *)local_80), iVar1 == 0)) {
        ERR_put_error(0xc,0,0x92,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                      ,0x29d);
        return 0;
      }
      if (((int)plen == 5) && (sVar2 = CBS_len((CBS *)local_80), sVar2 != 0)) {
        ERR_put_error(0xc,0,0xa4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                      ,0x2a1);
        return 0;
      }
      if ((int)plen == 1) {
        sVar2 = CBS_len((CBS *)local_80);
        if (sVar2 != 1) {
          ERR_put_error(0xc,0,0x6a,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                        ,0x2a6);
          return 0;
        }
        puVar3 = CBS_data((CBS *)local_80);
        if ((*puVar3 != '\0') && (*puVar3 != 0xff)) {
          ERR_put_error(0xc,0,0x6d,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                        ,0x2ab);
          return 0;
        }
      }
      plen._0_4_ = -3;
    }
  }
  if (ret == -1) {
    ret = (int)plen;
    utype = 0;
  }
  cont = *(uchar **)inlen_local;
  it_00 = (ASN1_ITEM *)it_local;
  plen._4_4_ = asn1_check_tlen((long *)&stack0xffffffffffffffb8,(int *)0x0,(uchar *)0x0,
                               (char *)((long)&p + 7),&cont,(long)it_local,ret,utype,opt);
  if (plen._4_4_ == 0) {
    ERR_put_error(0xc,0,0x9e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,0x2ba);
    pval_local._4_4_ = 0;
  }
  else if (plen._4_4_ == -1) {
    pval_local._4_4_ = -1;
  }
  else {
    plen._4_4_ = 0;
    is_string = (int)sStack_48;
    if ((((int)plen == 0x10) || ((int)plen == 0x11)) || ((int)plen == -3)) {
      if (((int)plen != -3) && (p._7_1_ == '\0')) {
        ERR_put_error(0xc,0,0xb2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                      ,0x2c5);
        return 0;
      }
      len = *(long *)inlen_local;
      is_string = ((int)cont - (int)len) + is_string;
    }
    else {
      if (p._7_1_ != '\0') {
        ERR_put_error(0xc,0,0xb3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                      ,0x2d0);
        return 0;
      }
      len = (long)cont;
    }
    cont = cont + sStack_48;
    iVar1 = asn1_ex_c2i((ASN1_VALUE **)in_local,(uchar *)len,is_string,(int)plen,
                        &_aclass_local->itype,it_00);
    if (iVar1 != 0) {
      *(uchar **)inlen_local = cont;
      plen._4_4_ = 1;
    }
    pval_local._4_4_ = plen._4_4_;
  }
  return pval_local._4_4_;
}

Assistant:

static int asn1_d2i_ex_primitive(ASN1_VALUE **pval, const unsigned char **in,
                                 long inlen, const ASN1_ITEM *it, int tag,
                                 int aclass, char opt) {
  int ret = 0, utype;
  long plen;
  char cst;
  const unsigned char *p;
  const unsigned char *cont = NULL;
  long len;
  if (!pval) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_NULL);
    return 0;  // Should never happen
  }

  assert(it->itype == ASN1_ITYPE_PRIMITIVE || it->itype == ASN1_ITYPE_MSTRING);
  if (it->itype == ASN1_ITYPE_MSTRING) {
    utype = tag;
    tag = -1;
  } else {
    utype = it->utype;
  }

  if (utype == V_ASN1_ANY || utype == V_ASN1_ANY_AS_STRING) {
    // If type is ANY need to figure out type from tag
    unsigned char oclass;
    if (tag >= 0) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_TAGGED_ANY);
      return 0;
    }
    if (opt) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_OPTIONAL_ANY);
      return 0;
    }
    const int is_string = utype == V_ASN1_ANY_AS_STRING;
    p = *in;
    ret = asn1_check_tlen(&plen, &utype, &oclass, &cst, &p, inlen, -1, 0, 0);
    if (!ret) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
      return 0;
    }
    if (!is_supported_universal_type(utype, oclass)) {
      utype = V_ASN1_OTHER;
    }
    // These three types are not represented as |ASN1_STRING|, so they must be
    // parsed separately and then treated as an opaque |V_ASN1_OTHER|.
    if (is_string && (utype == V_ASN1_OBJECT || utype == V_ASN1_NULL ||
                      utype == V_ASN1_BOOLEAN)) {
      if (cst) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_TYPE_NOT_PRIMITIVE);
        return 0;
      }
      CBS cbs;
      CBS_init(&cbs, p, plen);
      if (utype == V_ASN1_OBJECT && !CBS_is_valid_asn1_oid(&cbs)) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_OBJECT_ENCODING);
        return 0;
      }
      if (utype == V_ASN1_NULL && CBS_len(&cbs) != 0) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NULL_IS_WRONG_LENGTH);
        return 0;
      }
      if (utype == V_ASN1_BOOLEAN) {
        if (CBS_len(&cbs) != 1) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_BOOLEAN_IS_WRONG_LENGTH);
          return 0;
        }
        uint8_t v = CBS_data(&cbs)[0];
        if (v != 0 && v != 0xff) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
          return 0;
        }
      }
      utype = V_ASN1_OTHER;
    }
  }
  if (tag == -1) {
    tag = utype;
    aclass = V_ASN1_UNIVERSAL;
  }
  p = *in;
  // Check header
  ret = asn1_check_tlen(&plen, NULL, NULL, &cst, &p, inlen, tag, aclass, opt);
  if (!ret) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
    return 0;
  } else if (ret == -1) {
    return -1;
  }
  ret = 0;
  // SEQUENCE, SET and "OTHER" are left in encoded form
  if ((utype == V_ASN1_SEQUENCE) || (utype == V_ASN1_SET) ||
      (utype == V_ASN1_OTHER)) {
    // SEQUENCE and SET must be constructed
    if (utype != V_ASN1_OTHER && !cst) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_TYPE_NOT_CONSTRUCTED);
      return 0;
    }

    cont = *in;
    len = p - cont + plen;
    p += plen;
  } else if (cst) {
    // This parser historically supported BER constructed strings. We no
    // longer do and will gradually tighten this parser into a DER
    // parser. BER types should use |CBS_asn1_ber_to_der|.
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_TYPE_NOT_PRIMITIVE);
    return 0;
  } else {
    cont = p;
    len = plen;
    p += plen;
  }

  // We now have content length and type: translate into a structure
  if (!asn1_ex_c2i(pval, cont, len, utype, it)) {
    goto err;
  }

  *in = p;
  ret = 1;
err:
  return ret;
}